

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::h_IMUL_RCP(JitCompilerX86 *this,Instruction *instr,int i)

{
  bool bVar1;
  uint32_t uVar2;
  JitCompilerX86 *this_00;
  uint64_t val;
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint64_t divisor;
  
  uVar2 = Instruction::getImm32((Instruction *)0x151df5);
  this_00 = (JitCompilerX86 *)(ulong)uVar2;
  bVar1 = isZeroOrPowerOf2((uint64_t)this_00);
  if (!bVar1) {
    in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
    emit<2ul>(this_00,(uint8_t (*) [2])in_RDI);
    val = defyx_reciprocal_fast(this_00);
    emit64(in_RDI,val);
    emit<3ul>(this_00,(uint8_t (*) [3])in_RDI);
    emitByte(in_RDI,*(char *)(in_RSI + 1) * '\b' + 0xc0);
  }
  return;
}

Assistant:

void JitCompilerX86::h_IMUL_RCP(Instruction& instr, int i) {
		uint64_t divisor = instr.getImm32();
		if (!isZeroOrPowerOf2(divisor)) {
			registerUsage[instr.dst] = i;
			emit(MOV_RAX_I);
			emit64(defyx_reciprocal_fast(divisor));
			emit(REX_IMUL_RM);
			emitByte(0xc0 + 8 * instr.dst);
		}
	}